

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O0

void __thiscall
cppcms::impl::cgi::socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator>::
~socket_acceptor(socket_acceptor<cppcms::impl::cgi::http,_cppcms::impl::cgi::http_creator> *this)

{
  http_creator *in_RDI;
  
  *(undefined ***)&in_RDI->ip_ = &PTR_async_accept_00530f38;
  http_creator::~http_creator(in_RDI);
  booster::aio::acceptor::~acceptor((acceptor *)&in_RDI->watchdog_);
  std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection> *)0x4a2706);
  acceptor::~acceptor((acceptor *)0x4a2710);
  return;
}

Assistant:

socket_acceptor(cppcms::service &srv,std::string ip,int port,int backlog) :
				srv_(srv),
				acceptor_(srv_.get_io_service()),
				stopped_(false),
				tcp_(true),
				sndbuf_(-1),
				rcvbuf_(-1)
			{
				io::endpoint ep(ip,port);
				acceptor_.open(ep.family());
                #ifndef CPPCMS_WIN32
				acceptor_.set_option(io::basic_socket::reuse_address,true);
                #endif
				acceptor_.bind(ep);
				acceptor_.listen(backlog);
			}